

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O1

void __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::clear_children_counters
          (bt_impl<4096UL,_(bv::allocation_policy_t)0> *this,subtree_ref t,size_t begin,size_t end)

{
  ulong uVar1;
  size_t sVar2;
  word_type wVar3;
  word_type wVar4;
  word_type wVar5;
  long lVar6;
  word_type pattern;
  word_type pattern_00;
  
  uVar1 = this->degree;
  if (end < uVar1) {
    sVar2 = ((t.super_subtree_ref_base<false>._vector)->sizes)._width;
    lVar6 = (t.super_subtree_ref_base<false>._vector)->degree *
            t.super_subtree_ref_base<false>._index;
    wVar3 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::get
                      (&((t.super_subtree_ref_base<false>._vector)->sizes)._bits,
                       (lVar6 + -1 + end) * sVar2,(lVar6 + end) * sVar2);
  }
  else {
    wVar3 = this->size;
  }
  if (end < this->degree) {
    sVar2 = ((t.super_subtree_ref_base<false>._vector)->ranks)._width;
    lVar6 = (t.super_subtree_ref_base<false>._vector)->degree *
            t.super_subtree_ref_base<false>._index;
    wVar4 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::get
                      (&((t.super_subtree_ref_base<false>._vector)->ranks)._bits,
                       (lVar6 + -1 + end) * sVar2,(lVar6 + end) * sVar2);
  }
  else {
    wVar4 = this->rank;
  }
  if (begin == 0) {
    pattern = 0;
    pattern_00 = 0;
  }
  else {
    sVar2 = ((t.super_subtree_ref_base<false>._vector)->sizes)._width;
    lVar6 = (t.super_subtree_ref_base<false>._vector)->degree *
            t.super_subtree_ref_base<false>._index;
    wVar5 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::get
                      (&((t.super_subtree_ref_base<false>._vector)->sizes)._bits,
                       (lVar6 + -1 + begin) * sVar2,(lVar6 + begin) * sVar2);
    pattern = (word_type)(int)wVar5;
    sVar2 = ((t.super_subtree_ref_base<false>._vector)->ranks)._width;
    lVar6 = (t.super_subtree_ref_base<false>._vector)->degree *
            t.super_subtree_ref_base<false>._index;
    wVar5 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::get
                      (&((t.super_subtree_ref_base<false>._vector)->ranks)._bits,
                       (lVar6 + -1 + begin) * sVar2,(lVar6 + begin) * sVar2);
    pattern_00 = (word_type)(int)wVar5;
  }
  if (uVar1 < end) {
    end = uVar1;
  }
  lVar6 = (t.super_subtree_ref_base<false>._vector)->degree * t.super_subtree_ref_base<false>._index
  ;
  packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::set
            (&(t.super_subtree_ref_base<false>._vector)->sizes,lVar6 + begin,lVar6 + end,pattern);
  lVar6 = (t.super_subtree_ref_base<false>._vector)->degree * t.super_subtree_ref_base<false>._index
  ;
  packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::set
            (&(t.super_subtree_ref_base<false>._vector)->ranks,begin + lVar6,lVar6 + end,pattern_00)
  ;
  lVar6 = (t.super_subtree_ref_base<false>._vector)->degree * t.super_subtree_ref_base<false>._index
  ;
  packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::increment
            (&(t.super_subtree_ref_base<false>._vector)->sizes,lVar6 + end,lVar6 + this->degree,
             pattern - wVar3,may_overflow);
  lVar6 = t.super_subtree_ref_base<false>._index * (t.super_subtree_ref_base<false>._vector)->degree
  ;
  packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::increment
            (&(t.super_subtree_ref_base<false>._vector)->ranks,end + lVar6,lVar6 + this->degree,
             pattern_00 - wVar4,may_overflow);
  return;
}

Assistant:

void bt_impl<W, AP>::clear_children_counters(subtree_ref t,
                                                     size_t begin,
                                                     size_t end) const
        {
            size_t keys_end = min(end, degree);
            size_t last_size = end < degree ? t.sizes(end - 1)   : size;
            size_t last_rank = end < degree ? t.ranks(end - 1)   : rank;
            size_t prev_size = begin > 0    ? t.sizes(begin - 1) : 0;
            size_t prev_rank = begin > 0    ? t.ranks(begin - 1) : 0;
            
            assert(last_size >= prev_size);
            assert(last_rank >= prev_rank);
            
            t.sizes(begin, keys_end)   = prev_size;
            t.ranks(begin, keys_end)   = prev_rank;
            
            t.sizes(keys_end, degree) -= last_size - prev_size;
            t.ranks(keys_end, degree) -= last_rank - prev_rank;
        }